

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_assign_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  char *pcVar1;
  uchar *__dest;
  uint uVar2;
  
  pcVar1 = alloc_string(name);
  info->iccp_name = pcVar1;
  __dest = (uchar *)malloc((ulong)profile_size);
  info->iccp_profile = __dest;
  uVar2 = 0x53;
  if (__dest != (uchar *)0x0 && pcVar1 != (char *)0x0) {
    memcpy(__dest,profile,(ulong)profile_size);
    info->iccp_profile_size = profile_size;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static unsigned lodepng_assign_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size)
{
  info->iccp_name = alloc_string(name);
  info->iccp_profile = (unsigned char*)lodepng_malloc(profile_size);

  if(!info->iccp_name || !info->iccp_profile) return 83; /*alloc fail*/

  memcpy(info->iccp_profile, profile, profile_size);
  info->iccp_profile_size = profile_size;

  return 0; /*ok*/
}